

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O3

Vec3fa embree::MatteMaterial__sample
                 (ISPCMatteMaterial *This,BRDF *brdf,Vec3fa *Lw,Vec3fa *wo,DifferentialGeometry *dg,
                 Sample3f *wi_o,Medium *medium,Vec2f *s)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [12];
  float fVar11;
  float fVar12;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar13 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  vfloat4 a;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  Vec3fa VVar28;
  float *in_stack_00000018;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  uVar2 = *(undefined8 *)&(brdf->Ka).field_0;
  uVar3 = *(undefined8 *)((long)&(brdf->Ka).field_0 + 8);
  fVar8 = *in_stack_00000018;
  fVar5 = in_stack_00000018[1];
  if (fVar5 < 0.0) {
    fVar4 = sqrtf(fVar5);
  }
  else {
    fVar4 = SQRT(fVar5);
  }
  fVar5 = 1.0 - fVar5;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar6 = sinf(fVar8 * 6.2831855);
  fVar7 = cosf(fVar8 * 6.2831855);
  fVar7 = fVar7 * fVar5;
  fVar6 = fVar6 * fVar5;
  fVar8 = wi_o[2].v.field_0.m128[0];
  fVar5 = wi_o[2].v.field_0.m128[2];
  fVar9 = -wi_o[2].v.field_0.m128[1];
  fVar21 = -fVar5;
  auVar10._8_4_ = 0xffffffff;
  auVar10._0_8_ = 0xffffffffffffffff;
  if (fVar9 * fVar9 + fVar5 * fVar5 + 0.0 <= fVar8 * fVar8 + fVar21 * fVar21 + 0.0) {
    auVar10 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar5 = (float)((uint)fVar5 & auVar10._4_4_);
  fVar21 = (float)(~auVar10._0_4_ & (uint)fVar21);
  fVar16 = (float)(~auVar10._8_4_ & (uint)fVar8 | (uint)fVar9 & auVar10._8_4_);
  fVar8 = fVar5 * fVar5;
  fVar9 = fVar16 * fVar16;
  fVar22 = fVar8 + fVar21 * fVar21 + fVar9;
  fVar23 = fVar8 + fVar8 + 0.0;
  fVar9 = fVar8 + fVar9 + fVar9;
  fVar8 = fVar8 + 0.0 + 0.0;
  auVar24._4_4_ = fVar23;
  auVar24._0_4_ = fVar22;
  auVar24._8_4_ = fVar9;
  auVar24._12_4_ = fVar8;
  auVar25._4_4_ = fVar23;
  auVar25._0_4_ = fVar22;
  auVar25._8_4_ = fVar9;
  auVar25._12_4_ = fVar8;
  auVar25 = rsqrtss(auVar24,auVar25);
  fVar8 = auVar25._0_4_;
  fVar11 = fVar8 * 1.5 - fVar8 * fVar8 * fVar22 * 0.5 * fVar8;
  fVar21 = fVar11 * fVar21;
  fVar5 = fVar11 * fVar5;
  fVar16 = fVar11 * fVar16;
  fVar11 = fVar11 * 0.0;
  fVar8 = wi_o[2].v.field_0.m128[0];
  fVar9 = wi_o[2].v.field_0.m128[1];
  fVar22 = wi_o[2].v.field_0.m128[2];
  fVar23 = wi_o[2].v.field_0.m128[3];
  fVar12 = fVar5 * fVar8 - fVar9 * fVar21;
  fVar14 = fVar16 * fVar9 - fVar22 * fVar5;
  fVar17 = fVar21 * fVar22 - fVar8 * fVar16;
  fVar19 = fVar11 * fVar23 - fVar23 * fVar11;
  fVar15 = fVar14 * fVar14;
  fVar18 = fVar17 * fVar17;
  fVar20 = fVar19 * fVar19;
  fVar26 = fVar18 + fVar15 + fVar12 * fVar12;
  fVar27 = fVar20 + fVar15 + fVar15;
  fVar18 = fVar18 + fVar15 + fVar18;
  fVar20 = fVar20 + fVar15 + fVar20;
  auVar13._4_4_ = fVar27;
  auVar13._0_4_ = fVar26;
  auVar13._8_4_ = fVar18;
  auVar13._12_4_ = fVar20;
  auVar1._4_4_ = fVar27;
  auVar1._0_4_ = fVar26;
  auVar1._8_4_ = fVar18;
  auVar1._12_4_ = fVar20;
  auVar25 = rsqrtss(auVar13,auVar1);
  fVar15 = auVar25._0_4_;
  fVar15 = fVar15 * 1.5 - fVar15 * fVar15 * fVar26 * 0.5 * fVar15;
  fVar21 = fVar7 * fVar21 + fVar4 * fVar8 + fVar6 * fVar15 * fVar14;
  fVar5 = fVar7 * fVar5 + fVar4 * fVar9 + fVar6 * fVar15 * fVar17;
  fVar9 = fVar7 * fVar16 + fVar4 * fVar22 + fVar6 * fVar15 * fVar12;
  fVar6 = fVar7 * fVar11 + fVar4 * fVar23 + fVar6 * fVar15 * fVar19;
  (medium->transmission).field_0.m128[0] = fVar21;
  (medium->transmission).field_0.m128[1] = fVar5;
  (medium->transmission).field_0.m128[2] = fVar9;
  (medium->transmission).field_0.m128[3] = fVar6;
  local_28 = (float)uVar2;
  fStack_24 = (float)((ulong)uVar2 >> 0x20);
  fStack_20 = (float)uVar3;
  fStack_1c = (float)((ulong)uVar3 >> 0x20);
  medium->eta = fVar4 / 3.1415927;
  fVar8 = wi_o[2].v.field_0.m128[3];
  fVar5 = fVar9 * wi_o[2].v.field_0.m128[2] +
          fVar5 * wi_o[2].v.field_0.m128[1] + fVar21 * wi_o[2].v.field_0.m128[0];
  if (1.0 <= fVar5) {
    fVar5 = 1.0;
  }
  fVar4 = 0.0;
  if (0.0 <= fVar5) {
    fVar4 = fVar5;
  }
  VVar28.field_0._8_4_ = fVar4 * local_28 * 0.31830987;
  VVar28.field_0._12_4_ = fVar4 * fStack_24 * 0.31830987;
  (This->base).type = (int)VVar28.field_0._8_4_;
  (This->base).align[0] = (int)VVar28.field_0._12_4_;
  (This->base).align[1] = (int)(fVar4 * fStack_20 * 0.31830987);
  (This->base).align[2] = (int)(fVar4 * fStack_1c * 0.31830987);
  VVar28.field_0.m128[1] = fVar6 * fVar8;
  VVar28.field_0.m128[0] = fVar5;
  return (Vec3fa)VVar28.field_0;
}

Assistant:

Vec3fa MatteMaterial__sample(ISPCMatteMaterial* This, const BRDF& brdf, const Vec3fa& Lw, const Vec3fa& wo, const DifferentialGeometry& dg, Sample3f& wi_o, Medium& medium, const Vec2f& s)
{
  Lambertian lambertian = make_Lambertian(Vec3fa((Vec3fa)This->reflectance));
  return Lambertian__sample(&lambertian,wo,dg,wi_o,s);
}